

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O0

bool __thiscall ON_LinearWorkflow::operator==(ON_LinearWorkflow *this,ON_LinearWorkflow *lw)

{
  bool bVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  ON_LinearWorkflow *lw_local;
  ON_LinearWorkflow *this_local;
  
  bVar1 = PreProcessTexturesOn(this);
  bVar2 = PreProcessTexturesOn(lw);
  if (bVar1 == bVar2) {
    bVar1 = PreProcessColorsOn(this);
    bVar2 = PreProcessColorsOn(lw);
    if (bVar1 == bVar2) {
      bVar1 = PostProcessFrameBufferOn(this);
      bVar2 = PostProcessFrameBufferOn(lw);
      if (bVar1 == bVar2) {
        bVar1 = PreProcessGammaOn(this);
        bVar2 = PreProcessGammaOn(lw);
        if (bVar1 == bVar2) {
          bVar1 = PostProcessGammaOn(this);
          bVar2 = PostProcessGammaOn(lw);
          if (bVar1 == bVar2) {
            fVar3 = PreProcessGamma(this);
            fVar4 = PreProcessGamma(lw);
            bVar1 = IsFloatEqual(fVar3,fVar4);
            if (bVar1) {
              fVar3 = PostProcessGamma(this);
              fVar4 = PostProcessGamma(lw);
              bVar1 = IsFloatEqual(fVar3,fVar4);
              if (bVar1) {
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_LinearWorkflow::operator == (const ON_LinearWorkflow& lw) const
{
  // When checking equality, we need to directly check the underlying storage. So we can't allow
  // virtual overrides to execute because they might hide the real values we want to check.
  using LW = ON_LinearWorkflow;
  if (LW::PreProcessTexturesOn()         != lw.LW::PreProcessTexturesOn())     return false;
  if (LW::PreProcessColorsOn()           != lw.LW::PreProcessColorsOn())       return false;
  if (LW::PostProcessFrameBufferOn()     != lw.LW::PostProcessFrameBufferOn()) return false;
  if (LW::PreProcessGammaOn()            != lw.LW::PreProcessGammaOn())        return false;
  if (LW::PostProcessGammaOn()           != lw.LW::PostProcessGammaOn())       return false;
  if (!IsFloatEqual(LW::PreProcessGamma(),  lw.LW::PreProcessGamma()))         return false;
  if (!IsFloatEqual(LW::PostProcessGamma(), lw.LW::PostProcessGamma()))        return false;

  return true;
}